

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureSocket.cpp
# Opt level: O2

bool __thiscall Jupiter::SecureSocket::initSSL(SecureSocket *this)

{
  SSLData *pSVar1;
  SocketType fd;
  int iVar2;
  SSL *pSVar3;
  char *parg;
  long lVar4;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  
  OPENSSL_init_ssl(0x200002,0);
  OPENSSL_init_ssl(0,0);
  ctx = (SSL_CTX *)this->m_ssl_data->context;
  if (ctx == (SSL_CTX *)0x0) {
    meth = (SSL_METHOD *)this->m_ssl_data->method;
    if (meth == (SSL_METHOD *)0x0) {
      meth = (SSL_METHOD *)TLS_method();
      this->m_ssl_data->method = (SSL_METHOD *)meth;
      if (meth == (SSL_METHOD *)0x0) {
        return false;
      }
    }
    ctx = SSL_CTX_new(meth);
    pSVar1 = this->m_ssl_data;
    pSVar1->context = (SSL_CTX *)ctx;
    if (ctx == (SSL_CTX *)0x0) goto LAB_001471c7;
    if ((pSVar1->cert)._M_string_length != 0) {
      loadCertificate((SSL_CTX *)ctx,(pSVar1->cert)._M_dataplus._M_p,(pSVar1->key)._M_dataplus._M_p)
      ;
      ctx = (SSL_CTX *)this->m_ssl_data->context;
    }
  }
  pSVar3 = SSL_new(ctx);
  this->m_ssl_data->handle = (SSL *)pSVar3;
  if (pSVar3 != (SSL *)0x0) {
    fd = Socket::getDescriptor(&this->super_Socket);
    iVar2 = SSL_set_fd(pSVar3,fd);
    if (iVar2 != 0) {
      pSVar3 = (SSL *)this->m_ssl_data->handle;
      parg = Socket::getRemoteHostnameC(&this->super_Socket);
      lVar4 = SSL_ctrl(pSVar3,0x37,0,parg);
      if ((lVar4 == 1) && (iVar2 = SSL_connect((SSL *)this->m_ssl_data->handle), iVar2 == 1)) {
        return true;
      }
    }
  }
LAB_001471c7:
  ERR_print_errors_fp(_stderr);
  return false;
}

Assistant:

bool Jupiter::SecureSocket::initSSL() {
	SSL_load_error_strings();
	SSL_library_init();

	if (m_ssl_data->context == nullptr) {
		if (m_ssl_data->method == nullptr) {
			m_ssl_data->method = TLS_method();
			if (m_ssl_data->method == nullptr)
				return false;
		}

		m_ssl_data->context = SSL_CTX_new(m_ssl_data->method);
		if (m_ssl_data->context == nullptr) {
			ERR_print_errors_fp(stderr);
			return false;
		}
		if (!m_ssl_data->cert.empty()) {
			loadCertificate(m_ssl_data->context, m_ssl_data->cert.c_str(), m_ssl_data->key.c_str());
		}
	}

	m_ssl_data->handle = SSL_new(m_ssl_data->context);
	if (m_ssl_data->handle == nullptr) {
		ERR_print_errors_fp(stderr);
		return false;
	}

	// Not suppressing this warning; descriptor ideally shouldn't be getting shortened here, even if it's "safe"
	// TODO: Can't resolve this without removing OpenSSL usage on Windows; we should ideally use Windows APIs
	if (SSL_set_fd(m_ssl_data->handle, this->getDescriptor()) == 0) {
		ERR_print_errors_fp(stderr);
		return false;
	}
	if (SSL_set_tlsext_host_name(m_ssl_data->handle, this->getRemoteHostnameC()) != 1) {
		// This error check is potentially redundant, but no documentation has been found.
		ERR_print_errors_fp(stderr);
		return false;
	}
	int t = SSL_connect(m_ssl_data->handle);
	if (t != 1)
	{
		ERR_print_errors_fp(stderr);
		return false;
	}
	return true;
}